

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CoshLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_cosh(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  CoshLayerParams *pCVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_cosh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_cosh(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pCVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::CoshLayerParams>(arena);
    (this->layer_).cosh_ = pCVar2;
  }
  return (CoshLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CoshLayerParams* NeuralNetworkLayer::_internal_mutable_cosh() {
  if (!_internal_has_cosh()) {
    clear_layer();
    set_has_cosh();
    layer_.cosh_ = CreateMaybeMessage< ::CoreML::Specification::CoshLayerParams >(GetArenaForAllocation());
  }
  return layer_.cosh_;
}